

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O2

void fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  bool bVar2;
  fe_t_conflict2 acc;
  fe_t_conflict2 t3;
  fe_t_conflict2 t13;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t3,t1,acc);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t13,t3,acc);
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t13,t13,acc);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc,t1);
  iVar1 = 0x1f9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc,acc);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(acc,acc,t3);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc,acc);
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(output,acc,t13);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(fe_t output,
                                                          const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t13, t3;

    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t3, t1, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t13, t3, acc);
    for (i = 0; i < 4; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t13, t13, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, t1);
    for (i = 0; i < 505; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(acc, acc, t3);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(output, acc, t13);
}